

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeString.cpp
# Opt level: O1

EStatusCode __thiscall
UnicodeString::FromUTF16LE(UnicodeString *this,uchar *inString,unsigned_long inLength)

{
  ulong uVar1;
  size_t *psVar2;
  byte bVar3;
  uchar uVar4;
  ushort uVar5;
  bool bVar6;
  EStatusCode EVar7;
  _List_node_base *p_Var8;
  Trace *pTVar9;
  ulong uVar10;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->mUnicodeCharacters);
  if ((inLength & 1) == 0) {
    uVar10 = 0;
    do {
      uVar5 = CONCAT11(inString[uVar10 + 1],inString[uVar10]);
      if ((inString[uVar10 + 1] & 0xfc) == 0xd8) {
        uVar1 = uVar10 + 2;
        if ((uVar1 < inLength - 1) && (bVar3 = inString[uVar10 + 3], (bVar3 & 0xfc) == 0xdc)) {
          uVar4 = inString[uVar1];
          p_Var8 = (_List_node_base *)operator_new(0x18);
          p_Var8[1]._M_next =
               (_List_node_base *)
               (ulong)((uint)uVar5 * 0x400 + (uint)CONCAT11(bVar3,uVar4) + 0xfca02400);
          std::__detail::_List_node_base::_M_hook(p_Var8);
          psVar2 = &(this->mUnicodeCharacters).
                    super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
                    _M_size;
          *psVar2 = *psVar2 + 1;
          EVar7 = eSuccess;
          bVar6 = true;
          uVar10 = uVar1;
        }
        else {
          pTVar9 = Trace::DefaultTrace();
          bVar6 = false;
          Trace::TraceToLog(pTVar9,
                            "UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate"
                           );
          EVar7 = eFailure;
          uVar10 = uVar1;
        }
      }
      else {
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = (_List_node_base *)(ulong)uVar5;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar2 = &(this->mUnicodeCharacters).
                  super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
                  _M_size;
        *psVar2 = *psVar2 + 1;
        EVar7 = eSuccess;
        bVar6 = true;
      }
    } while ((bVar6) && (uVar10 = uVar10 + 2, bVar6 && uVar10 < inLength - 1));
  }
  else {
    pTVar9 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar9,
                      "UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters"
                     );
    EVar7 = eFailure;
  }
  return EVar7;
}

Assistant:

EStatusCode UnicodeString::FromUTF16LE(const unsigned char* inString, unsigned long inLength)
{
	mUnicodeCharacters.clear();
	EStatusCode status = PDFHummus::eSuccess;

	if(inLength % 2 != 0)
	{
		TRACE_LOG("UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters");
		return PDFHummus::eFailure;
	}

	for(unsigned long i = 0; i < inLength-1 && PDFHummus::eSuccess == status; i+=2)
	{
		unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];

		if(0xD800 <= buffer && buffer <= 0xDBFF) 
		{
			// Aha! high surrogate! this means that this character requires 2 w_chars
			unsigned short highSurrogate = buffer;
			i+=2;
			if(i>=inLength-1)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];
			if(0xDC00 > buffer|| buffer > 0xDFFF)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short lowSurrogate = buffer;

			mUnicodeCharacters.push_back(0x10000 + ((highSurrogate - 0xD800) << 10) + (lowSurrogate - 0xDC00));
		}
		else
			mUnicodeCharacters.push_back(buffer);		
	}

	return status;
}